

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

bool duckdb_yyjson::skip_spaces_and_comments(u8 **ptr)

{
  byte *pbVar1;
  short sVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  
  psVar5 = (short *)*ptr;
  psVar4 = (short *)*ptr;
  while( true ) {
    while( true ) {
      while (psVar3 = psVar5, sVar2 = *psVar3, sVar2 == 0x2f2f) {
        psVar5 = (short *)((long)psVar3 + 1);
        do {
          pbVar1 = (byte *)((long)psVar5 + 1);
          psVar5 = (short *)((long)psVar5 + 1);
        } while ((char_table[*pbVar1] & 0x40) == 0);
      }
      if (sVar2 != 0x2a2f) break;
      for (psVar5 = psVar3 + 2; psVar4 = psVar3, psVar5[-1] != 0x2f2a;
          psVar5 = (short *)((long)psVar5 + 1)) {
        if ((char)psVar5[-1] == '\0') {
          *ptr = (u8 *)psVar3;
          return false;
        }
      }
    }
    if ((char_table[(byte)sVar2] & 1) == 0) break;
    do {
      pbVar1 = (byte *)((long)psVar3 + 1);
      psVar3 = (short *)((long)psVar3 + 1);
      psVar5 = psVar3;
    } while ((char_table[*pbVar1] & 1) != 0);
  }
  *ptr = (u8 *)psVar3;
  return psVar4 != psVar3;
}

Assistant:

static_noinline bool skip_spaces_and_comments(u8 **ptr) {
    u8 *hdr = *ptr;
    u8 *cur = *ptr;
    u8 **end = ptr;
    while (true) {
        if (byte_match_2(cur, "/*")) {
            hdr = cur;
            cur += 2;
            while (true) {
                if (byte_match_2(cur, "*/")) {
                    cur += 2;
                    break;
                }
                if (*cur == 0) {
                    *end = hdr;
                    return false;
                }
                cur++;
            }
            continue;
        }
        if (byte_match_2(cur, "//")) {
            cur += 2;
            while (!char_is_line_end(*cur)) cur++;
            continue;
        }
        if (char_is_space(*cur)) {
            cur += 1;
            while (char_is_space(*cur)) cur++;
            continue;
        }
        break;
    }
    *end = cur;
    return hdr != cur;
}